

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void __thiscall ImGuiTextBuffer::appendfv(ImGuiTextBuffer *this,char *fmt,__va_list_tag *args)

{
  int *piVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  char *pcVar5;
  int iVar6;
  char *pcVar7;
  int iVar8;
  va_list args_copy;
  undefined8 local_48;
  void *pvStack_40;
  void *local_38;
  
  local_38 = args->reg_save_area;
  local_48._0_4_ = args->gp_offset;
  local_48._4_4_ = args->fp_offset;
  pvStack_40 = args->overflow_arg_area;
  iVar3 = vsnprintf((char *)0x0,0,fmt,args);
  if (0 < iVar3) {
    iVar8 = (this->Buf).Size;
    iVar2 = (this->Buf).Capacity;
    iVar8 = iVar8 + (uint)(iVar8 == 0);
    iVar4 = iVar3 + iVar8;
    if (iVar2 <= iVar4) {
      iVar6 = iVar2 * 2;
      if (iVar2 * 2 < iVar4) {
        iVar6 = iVar4;
      }
      if (iVar2 < iVar6) {
        if (GImGui != (ImGuiContext *)0x0) {
          piVar1 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar1 = *piVar1 + 1;
        }
        pcVar5 = (char *)(*GImAllocatorAllocFunc)((long)iVar6,GImAllocatorUserData);
        pcVar7 = (this->Buf).Data;
        if (pcVar7 != (char *)0x0) {
          memcpy(pcVar5,pcVar7,(long)(this->Buf).Size);
          pcVar7 = (this->Buf).Data;
          if ((pcVar7 != (char *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
            piVar1 = &(GImGui->IO).MetricsActiveAllocations;
            *piVar1 = *piVar1 + -1;
          }
          (*GImAllocatorFreeFunc)(pcVar7,GImAllocatorUserData);
        }
        (this->Buf).Data = pcVar5;
        (this->Buf).Capacity = iVar6;
      }
    }
    iVar2 = (this->Buf).Capacity;
    if (iVar2 < iVar4) {
      if (iVar2 == 0) {
        iVar6 = 8;
      }
      else {
        iVar6 = iVar2 / 2 + iVar2;
      }
      if (iVar6 <= iVar4) {
        iVar6 = iVar4;
      }
      if (iVar2 < iVar6) {
        if (GImGui != (ImGuiContext *)0x0) {
          piVar1 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar1 = *piVar1 + 1;
        }
        pcVar5 = (char *)(*GImAllocatorAllocFunc)((long)iVar6,GImAllocatorUserData);
        pcVar7 = (this->Buf).Data;
        if (pcVar7 != (char *)0x0) {
          memcpy(pcVar5,pcVar7,(long)(this->Buf).Size);
          pcVar7 = (this->Buf).Data;
          if ((pcVar7 != (char *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
            piVar1 = &(GImGui->IO).MetricsActiveAllocations;
            *piVar1 = *piVar1 + -1;
          }
          (*GImAllocatorFreeFunc)(pcVar7,GImAllocatorUserData);
        }
        (this->Buf).Data = pcVar5;
        (this->Buf).Capacity = iVar6;
      }
    }
    (this->Buf).Size = iVar4;
    pcVar7 = (this->Buf).Data;
    iVar4 = vsnprintf(pcVar7 + (long)iVar8 + -1,(ulong)(iVar3 + 1U),fmt,&local_48);
    pcVar7 = pcVar7 + (long)iVar8 + -1;
    if (pcVar7 != (char *)0x0) {
      iVar8 = iVar3;
      if (iVar4 < (int)(iVar3 + 1U)) {
        iVar8 = iVar4;
      }
      if (iVar4 == -1) {
        iVar8 = iVar3;
      }
      pcVar7[iVar8] = '\0';
    }
  }
  return;
}

Assistant:

void ImGuiTextBuffer::appendfv(const char* fmt, va_list args)
{
    va_list args_copy;
    va_copy(args_copy, args);

    int len = ImFormatStringV(NULL, 0, fmt, args);         // FIXME-OPT: could do a first pass write attempt, likely successful on first pass.
    if (len <= 0)
    {
        va_end(args_copy);
        return;
    }

    // Add zero-terminator the first time
    const int write_off = (Buf.Size != 0) ? Buf.Size : 1;
    const int needed_sz = write_off + len;
    if (write_off + len >= Buf.Capacity)
    {
        int double_capacity = Buf.Capacity * 2;
        Buf.reserve(needed_sz > double_capacity ? needed_sz : double_capacity);
    }

    Buf.resize(needed_sz);
    ImFormatStringV(&Buf[write_off - 1], (size_t)len + 1, fmt, args_copy);
    va_end(args_copy);
}